

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterFactory.cpp
# Opt level: O2

shared_ptr<ApprovalTests::Reporter> * ApprovalTests::DefaultReporterFactory::defaultReporter(void)

{
  int iVar1;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  if (defaultReporter()::reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&defaultReporter()::reporter);
    if (iVar1 != 0) {
      ::std::make_shared<ApprovalTests::DiffReporter>();
      defaultReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_10._M_pi;
      defaultReporter::reporter.
      super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
      _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
      __cxa_atexit(::std::__shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&defaultReporter::reporter,&__dso_handle);
      __cxa_guard_release(&defaultReporter()::reporter);
    }
  }
  return &defaultReporter::reporter;
}

Assistant:

std::shared_ptr<Reporter>& DefaultReporterFactory::defaultReporter()
    {
        static std::shared_ptr<Reporter> reporter = std::make_shared<DiffReporter>();
        return reporter;
    }